

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::BitmapImage::BitmapImage(BitmapImage *this,FILE *f,size_t width,size_t height)

{
  uint8_t *data;
  size_t size;
  size_t height_local;
  size_t width_local;
  FILE *f_local;
  BitmapImage *this_local;
  
  BitmapImage(this,width,height);
  data = this->data;
  size = get_data_size(this);
  freadx(f,data,size);
  return;
}

Assistant:

BitmapImage::BitmapImage(FILE* f, size_t width, size_t height)
    : BitmapImage(width, height) {
  freadx(f, this->data, this->get_data_size());
}